

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposition.hpp
# Opt level: O0

bool __thiscall diy::detail::Div<float>::operator<(Div<float> *this,Div<float> rhs)

{
  float fVar1;
  Div<float> *this_local;
  Div<float> rhs_local;
  bool local_1;
  
  fVar1 = rhs.b_size;
  if ((this->b_size != fVar1) || (NAN(this->b_size) || NAN(fVar1))) {
    local_1 = fVar1 < this->b_size;
  }
  else {
    rhs_local.nb = rhs.nb;
    if (this->nb == rhs_local.nb) {
      rhs_local.dim = rhs.dim;
      local_1 = this->dim < rhs_local.dim;
    }
    else {
      local_1 = this->nb < rhs_local.nb;
    }
  }
  return local_1;
}

Assistant:

bool operator<(Div rhs) const
    {
        // sort on second value of the pair unless tied, in which case sort on first
        if (b_size == rhs.b_size)
        {
            if (nb == rhs.nb)
                return(dim < rhs.dim);
            return(nb < rhs.nb);
        }
        return(b_size > rhs.b_size);
    }